

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean enexto_core_range(coord *cc,level *lev,xchar xx,xchar yy,permonst *mdat,uint entflags,
                         int start_range)

{
  boolean bVar1;
  int iVar2;
  coord *pcVar3;
  bool bVar4;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined1 local_f8 [8];
  monst fakemon;
  int ymax;
  int ymin;
  int xmax;
  int xmin;
  int i;
  int range;
  int y;
  int x;
  coord *good_ptr;
  coord good [15];
  monst *pmStack_30;
  uint entflags_local;
  permonst *mdat_local;
  xchar yy_local;
  xchar xx_local;
  level *lev_local;
  coord *cc_local;
  
  pmStack_30 = (monst *)mdat;
  if (mdat == (permonst *)0x0) {
    pmStack_30 = (monst *)(mons + u.umonster);
  }
  fakemon.nmon = pmStack_30;
  _y = (coord *)&good_ptr;
  xmin = start_range;
  unique0x100002fe = entflags;
  do {
    if (xx - xmin < 1) {
      local_fc = 1;
    }
    else {
      local_fc = xx - xmin;
    }
    if (xx + xmin < 0x50) {
      local_100 = xx + xmin;
    }
    else {
      local_100 = 0x4f;
    }
    if (yy - xmin < 0) {
      local_104 = 0;
    }
    else {
      local_104 = yy - xmin;
    }
    fakemon._116_4_ = local_104;
    if (yy + xmin < 0x15) {
      local_108 = yy + xmin;
    }
    else {
      local_108 = 0x14;
    }
    fakemon.meating = local_108;
    for (range = local_fc; range <= local_100; range = range + 1) {
      bVar1 = goodpos(lev,range,fakemon._116_4_,(monst *)local_f8,stack0xffffffffffffffcc);
      if (bVar1 != '\0') {
        _y->x = (xchar)range;
        _y->y = fakemon._116_1_;
        pcVar3 = _y + 1;
        bVar4 = _y == good + 10;
        _y = pcVar3;
        if (bVar4) goto LAB_002f6fdd;
      }
    }
    for (range = local_fc; i = fakemon._116_4_, range <= local_100; range = range + 1) {
      bVar1 = goodpos(lev,range,fakemon.meating,(monst *)local_f8,stack0xffffffffffffffcc);
      if (bVar1 != '\0') {
        _y->x = (xchar)range;
        _y->y = (xchar)fakemon.meating;
        pcVar3 = _y + 1;
        bVar4 = _y == good + 10;
        _y = pcVar3;
        if (bVar4) goto LAB_002f6fdd;
      }
    }
    while (i = i + 1, iVar2 = fakemon._116_4_, i < fakemon.meating) {
      bVar1 = goodpos(lev,local_fc,i,(monst *)local_f8,stack0xffffffffffffffcc);
      if (bVar1 != '\0') {
        _y->x = (xchar)local_fc;
        _y->y = (xchar)i;
        pcVar3 = _y + 1;
        bVar4 = _y == good + 10;
        _y = pcVar3;
        if (bVar4) goto LAB_002f6fdd;
      }
    }
    while (i = iVar2 + 1, i < fakemon.meating) {
      bVar1 = goodpos(lev,local_100,i,(monst *)local_f8,stack0xffffffffffffffcc);
      iVar2 = i;
      if (bVar1 != '\0') {
        _y->x = (xchar)local_100;
        _y->y = (xchar)i;
        pcVar3 = _y + 1;
        bVar4 = _y == good + 10;
        _y = pcVar3;
        if (bVar4) goto LAB_002f6fdd;
      }
    }
    xmin = xmin + 1;
    if ((0x15 < xmin) && (0x50 < xmin)) {
      return '\0';
    }
  } while (_y == (coord *)&good_ptr);
LAB_002f6fdd:
  iVar2 = rn2((int)((long)_y - (long)&good_ptr >> 1));
  cc->x = good[(long)iVar2 + -4].x;
  cc->y = good[(long)iVar2 + -4].y;
  return '\x01';
}

Assistant:

boolean enexto_core_range(coord *cc, struct level *lev, xchar xx, xchar yy,
			  const struct permonst *mdat, unsigned entflags,
			  int start_range) /* distance to begin tile check (>= 1) */
{
#define MAX_GOOD 15
    coord good[MAX_GOOD], *good_ptr;
    int x, y, range, i;
    int xmin, xmax, ymin, ymax;
    struct monst fakemon;	/* dummy monster */

    if (!mdat) {
	/* default to player's original monster type */
	mdat = &mons[u.umonster];
    }
    
    fakemon.data = mdat;	/* set up for goodpos */
    good_ptr = good;
    range = start_range;
    /*
     * Walk around the border of the square with center (xx,yy) and
     * radius range.  Stop when we find at least one valid position.
     */
    do {
	xmin = max(1, xx-range);
	xmax = min(COLNO-1, xx+range);
	ymin = max(0, yy-range);
	ymax = min(ROWNO-1, yy+range);

	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymin, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymin ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymax, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymax ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmin, y, &fakemon, entflags)) {
		good_ptr->x = xmin;
		good_ptr-> y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmax, y, &fakemon, entflags)) {
		good_ptr->x = xmax;
		good_ptr->y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	range++;

	/* return if we've grown too big (nothing is valid) */
	if (range > ROWNO && range > COLNO) return FALSE;
    } while (good_ptr == good);

full:
    i = rn2((int)(good_ptr - good));
    cc->x = good[i].x;
    cc->y = good[i].y;
    return TRUE;
}